

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * submitblock(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff678;
  RPCArg *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff690;
  RPCResults *in_stack_fffffffffffff6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b0;
  allocator<char> *in_stack_fffffffffffff6b8;
  iterator in_stack_fffffffffffff6c0;
  RPCArgOptions *in_stack_fffffffffffff6c8;
  string *in_stack_fffffffffffff6d0;
  Fallback *in_stack_fffffffffffff6d8;
  string *in_stack_fffffffffffff6e0;
  undefined1 *puVar2;
  string *in_stack_fffffffffffff6e8;
  RPCArg *in_stack_fffffffffffff6f0;
  Type type;
  string *psVar3;
  string *in_stack_fffffffffffff6f8;
  string *psVar4;
  RPCResult *in_stack_fffffffffffff700;
  RPCResults *results_00;
  undefined7 in_stack_fffffffffffff7d0;
  undefined1 uVar5;
  RPCHelpMan *this_00;
  allocator<char> local_7ac;
  allocator<char> local_7ab;
  allocator<char> local_7aa;
  allocator<char> local_7a9;
  pointer local_7a8;
  pointer pRStack_7a0;
  pointer local_798;
  allocator<char> local_78b;
  allocator<char> local_78a;
  allocator<char> local_789 [38];
  allocator<char> local_763;
  allocator<char> local_762;
  allocator<char> local_761 [29];
  allocator<char> local_744;
  allocator<char> local_743;
  allocator<char> local_742;
  allocator<char> local_741 [8];
  allocator<char> local_739 [25];
  undefined8 in_stack_fffffffffffff8e0;
  string local_558 [4];
  string local_4d0 [4];
  string local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  results_00 = (RPCResults *)&stack0xfffffffffffff8e7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_741[1] = (allocator<char>)0x0;
  local_741[2] = (allocator<char>)0x0;
  local_741[3] = (allocator<char>)0x0;
  local_741[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff688,(Optional *)in_stack_fffffffffffff680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff690);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff678);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                 (Type)((ulong)in_stack_fffffffffffff6e0 >> 0x20),in_stack_fffffffffffff6d8,
                 in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff688,in_stack_fffffffffffff680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_448._M_dataplus._M_p._0_1_ = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff690);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff678);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                 (Type)((ulong)in_stack_fffffffffffff6e0 >> 0x20),in_stack_fffffffffffff6d8,
                 in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  type = (Type)((ulong)in_stack_fffffffffffff6f0 >> 0x20);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff678);
  __l._M_len = (size_type)in_stack_fffffffffffff6c8;
  __l._M_array = in_stack_fffffffffffff6c0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6b8,__l,
             (allocator_type *)in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_789[1] = (allocator<char>)0x0;
  local_789[2] = (allocator<char>)0x0;
  local_789[3] = (allocator<char>)0x0;
  local_789[4] = (allocator<char>)0x0;
  local_789[5] = (allocator<char>)0x0;
  local_789[6] = (allocator<char>)0x0;
  local_789[7] = (allocator<char>)0x0;
  local_789[8] = (allocator<char>)0x0;
  local_789[9] = (allocator<char>)0x0;
  local_789[10] = (allocator<char>)0x0;
  local_789[0xb] = (allocator<char>)0x0;
  local_789[0xc] = (allocator<char>)0x0;
  local_789[0xd] = (allocator<char>)0x0;
  local_789[0xe] = (allocator<char>)0x0;
  local_789[0xf] = (allocator<char>)0x0;
  local_789[0x10] = (allocator<char>)0x0;
  local_789[0x11] = (allocator<char>)0x0;
  local_789[0x12] = (allocator<char>)0x0;
  local_789[0x13] = (allocator<char>)0x0;
  local_789[0x14] = (allocator<char>)0x0;
  local_789[0x15] = (allocator<char>)0x0;
  local_789[0x16] = (allocator<char>)0x0;
  local_789[0x17] = (allocator<char>)0x0;
  local_789[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff678);
  RPCResult::RPCResult
            (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,type,in_stack_fffffffffffff6e8,
             in_stack_fffffffffffff6e0,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6d8);
  psVar4 = local_4d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_7a8 = (pointer)0x0;
  pRStack_7a0 = (pointer)0x0;
  local_798 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff678);
  RPCResult::RPCResult
            (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,type,in_stack_fffffffffffff6e8,
             in_stack_fffffffffffff6e0,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6d8);
  uVar5 = 0;
  psVar3 = local_558;
  this_00 = (RPCHelpMan *)0x2;
  results._M_len = (size_type)in_stack_fffffffffffff6c8;
  results._M_array = (iterator)in_stack_fffffffffffff6c0;
  RPCResults::RPCResults(in_stack_fffffffffffff6a0,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  HelpExampleCli(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  HelpExampleRpc(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  std::operator+(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff678,(string *)0x6177de);
  this = (RPCArg *)&stack0xfffffffffffff830;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<submitblock()::__0,void>
            (in_stack_fffffffffffff688,(anon_class_1_0_00000001 *)in_stack_fffffffffffff680);
  RPCHelpMan::RPCHelpMan
            (this_00,psVar3,psVar4,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)CONCAT17(uVar5,in_stack_fffffffffffff7d0),
             results_00,(RPCExamples *)in_RDI,(RPCMethodImpl *)in_stack_fffffffffffff8e0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7ac);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7ab);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7aa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7a9);
  RPCResults::~RPCResults((RPCResults *)this);
  psVar4 = local_558;
  psVar3 = &local_448;
  do {
    psVar3 = (string *)((long)&psVar3[-5].field_2 + 8);
    RPCResult::~RPCResult((RPCResult *)this);
  } while (psVar3 != psVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff688);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_78b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_78a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_789);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff688);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_763);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_762);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_761);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff688);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_744);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_743);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_742);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_741);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_739);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8e6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8e7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan submitblock()
{
    // We allow 2 arguments for compliance with BIP22. Argument 2 is ignored.
    return RPCHelpMan{"submitblock",
        "\nAttempts to submit new block to network.\n"
        "See https://en.bitcoin.it/wiki/BIP_0022 for full specification.\n",
        {
            {"hexdata", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "the hex-encoded block data to submit"},
            {"dummy", RPCArg::Type::STR, RPCArg::DefaultHint{"ignored"}, "dummy value, for compatibility with BIP22. This value is ignored."},
        },
        {
            RPCResult{"If the block was accepted", RPCResult::Type::NONE, "", ""},
            RPCResult{"Otherwise", RPCResult::Type::STR, "", "According to BIP22"},
        },
        RPCExamples{
                    HelpExampleCli("submitblock", "\"mydata\"")
            + HelpExampleRpc("submitblock", "\"mydata\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CBlock> blockptr = std::make_shared<CBlock>();
    CBlock& block = *blockptr;
    if (!DecodeHexBlk(block, request.params[0].get_str())) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "Block decode failed");
    }

    if (block.vtx.empty() || !block.vtx[0]->IsCoinBase()) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "Block does not start with a coinbase");
    }

    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    uint256 hash = block.GetHash();
    {
        LOCK(cs_main);
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(hash);
        if (pindex) {
            if (pindex->IsValid(BLOCK_VALID_SCRIPTS)) {
                return "duplicate";
            }
            if (pindex->nStatus & BLOCK_FAILED_MASK) {
                return "duplicate-invalid";
            }
        }
    }

    {
        LOCK(cs_main);
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(block.hashPrevBlock);
        if (pindex) {
            chainman.UpdateUncommittedBlockStructures(block, pindex);
        }
    }

    NodeContext& node = EnsureAnyNodeContext(request.context);
    Mining& miner = EnsureMining(node);

    bool new_block;
    auto sc = std::make_shared<submitblock_StateCatcher>(block.GetHash());
    CHECK_NONFATAL(chainman.m_options.signals)->RegisterSharedValidationInterface(sc);
    bool accepted = miner.processNewBlock(blockptr, /*new_block=*/&new_block);
    CHECK_NONFATAL(chainman.m_options.signals)->UnregisterSharedValidationInterface(sc);
    if (!new_block && accepted) {
        return "duplicate";
    }
    if (!sc->found) {
        return "inconclusive";
    }
    return BIP22ValidationResult(sc->state);
},
    };
}